

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.h
# Opt level: O3

HeapMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
* __thiscall
TinyGC::
MakeGarbageCollected<HeapMap<int,std::__cxx11::string,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
          (TinyGC *this)

{
  HeapMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *pHVar1;
  ostream *poVar2;
  __hashtable *__h;
  __node_gen_type __node_gen;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lck;
  
  local_30 = (undefined1  [8])&this->alloc_mxt_;
  lck._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  lck._M_device._0_1_ = 1;
  CheckThreshold(this);
  pHVar1 = (HeapMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
            *)calloc(1,0x48);
  (pHVar1->
  super_GarbageCollected<HeapMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ).super_GarbageCollectedBase.obj_size_ = 0x48;
  (pHVar1->
  super_GarbageCollected<HeapMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ).super_GarbageCollectedBase._vptr_GarbageCollectedBase = (_func_int **)&PTR_Trace_00109be0;
  (pHVar1->map_)._M_h._M_buckets = &(pHVar1->map_)._M_h._M_single_bucket;
  (pHVar1->map_)._M_h._M_bucket_count = 1;
  (pHVar1->map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Object is allocated at ",0x17);
  poVar2 = std::ostream::_M_insert<void_const*>(&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::
  _Hashtable<GarbageCollectedBase*,GarbageCollectedBase*,std::allocator<GarbageCollectedBase*>,std::__detail::_Identity,std::equal_to<GarbageCollectedBase*>,std::hash<GarbageCollectedBase*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<GarbageCollectedBase*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<GarbageCollectedBase*,false>>>>
            ((_Hashtable<GarbageCollectedBase*,GarbageCollectedBase*,std::allocator<GarbageCollectedBase*>,std::__detail::_Identity,std::equal_to<GarbageCollectedBase*>,std::hash<GarbageCollectedBase*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)this);
  this->bytes_allocated_ =
       this->bytes_allocated_ +
       (pHVar1->
       super_GarbageCollected<HeapMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
       ).super_GarbageCollectedBase.obj_size_;
  this->size_of_objects_ = this->size_of_objects_ + 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return pHVar1;
}

Assistant:

T *TinyGC::MakeGarbageCollected(Args &&...args) {
  std::unique_lock<std::mutex> lck(alloc_mxt_);
  CheckThreshold();
  T *new_obj = ::new (malloc(sizeof(T))) T(std::forward<Args>(args)...);
  LOG("Object is allocated at " << new_obj);
  objs_addr_.insert(new_obj);
  this->bytes_allocated_ += new_obj->GetObjSize();
  this->size_of_objects_++;
  return new_obj;
}